

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__linear_to_rgbe(uchar *rgbe,float *linear)

{
  float fVar1;
  float fVar2;
  float fVar3;
  char local_1c [4];
  
  fVar1 = *linear;
  fVar2 = linear[1];
  if (linear[1] <= linear[2]) {
    fVar2 = linear[2];
  }
  fVar3 = fVar1;
  if (fVar1 <= fVar2) {
    fVar3 = fVar2;
  }
  if (1e-32 <= fVar3) {
    fVar2 = frexpf(fVar3,(int *)local_1c);
    fVar3 = (fVar2 * 256.0) / fVar3;
    *rgbe = (uchar)(int)(fVar1 * fVar3);
    rgbe[1] = (uchar)(int)(linear[1] * fVar3);
    rgbe[2] = (uchar)(int)(fVar3 * linear[2]);
    rgbe[3] = local_1c[0] + 0x80;
  }
  else {
    rgbe[0] = '\0';
    rgbe[1] = '\0';
    rgbe[2] = '\0';
    rgbe[3] = '\0';
  }
  return;
}

Assistant:

void stbiw__linear_to_rgbe(unsigned char *rgbe, float *linear) {
  int exponent;
  float maxcomp = stbiw__max(linear[0], stbiw__max(linear[1], linear[2]));

  if (maxcomp < 1e-32f) {
    rgbe[0] = rgbe[1] = rgbe[2] = rgbe[3] = 0;
  } else {
    float normalize = (float)frexp(maxcomp, &exponent) * 256.0f / maxcomp;

    rgbe[0] = (unsigned char)(linear[0] * normalize);
    rgbe[1] = (unsigned char)(linear[1] * normalize);
    rgbe[2] = (unsigned char)(linear[2] * normalize);
    rgbe[3] = (unsigned char)(exponent + 128);
  }
}